

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

int mi_reserve_os_memory_ex
              (size_t size,_Bool commit,_Bool allow_large,_Bool exclusive,mi_arena_id_t *arena_id)

{
  mi_memid_t memid_00;
  mi_memid_t memid_01;
  byte bVar1;
  _Bool _Var2;
  mi_arena_id_t mVar3;
  void *addr;
  void *pvVar4;
  uintptr_t uVar5;
  byte in_CL;
  byte bVar6;
  byte in_DL;
  byte bVar7;
  char *pcVar8;
  byte in_SIL;
  uintptr_t in_RDI;
  mi_arena_id_t *in_R8;
  mi_memid_t *unaff_retaddr;
  undefined6 in_stack_00000008;
  _Bool in_stack_0000000e;
  _Bool in_stack_0000000f;
  undefined7 in_stack_00000010;
  _Bool in_stack_00000017;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  size_t in_stack_00000020;
  _Bool is_large;
  void *start;
  mi_memid_t memid;
  undefined5 in_stack_00000050;
  byte local_28;
  undefined1 still_committed;
  undefined5 in_stack_ffffffffffffffe8;
  int local_4;
  
  bVar7 = in_SIL & 1;
  bVar6 = in_DL & 1;
  bVar1 = in_CL & 1;
  if (in_R8 != (mi_arena_id_t *)0x0) {
    mVar3 = _mi_arena_id_none();
    *in_R8 = mVar3;
  }
  still_committed = (undefined1)((ulong)in_R8 >> 0x38);
  addr = (void *)_mi_align_up(in_RDI,0x2000000);
  pvVar4 = _mi_os_alloc_aligned
                     (CONCAT44(in_stack_0000001c,in_stack_00000018),
                      CONCAT17(in_stack_00000017,in_stack_00000010),in_stack_0000000f,
                      in_stack_0000000e,unaff_retaddr);
  if (pvVar4 == (void *)0x0) {
    local_4 = 0xc;
  }
  else {
    memid_01.mem.os.size = (size_t)arena_id;
    memid_01.mem.os.base = (void *)memid._16_8_;
    memid_01._16_5_ = in_stack_00000050;
    memid_01.memkind._1_1_ = exclusive;
    memid_01.memkind._2_1_ = allow_large;
    memid_01.memkind._3_1_ = commit;
    _Var2 = mi_manage_os_memory_ex2
                      (start,in_stack_00000020,in_stack_0000001c._3_1_,in_stack_00000018,
                       in_stack_00000017,memid_01,
                       (mi_arena_id_t *)
                       CONCAT17(in_stack_0000000f,CONCAT16(in_stack_0000000e,in_stack_00000008)));
    if (_Var2) {
      uVar5 = _mi_divide_up((uintptr_t)addr,0x400);
      pcVar8 = "";
      if ((local_28 & 1) != 0) {
        pcVar8 = " (in large os pages)";
      }
      _mi_verbose_message("reserved %zu KiB memory%s\n",uVar5,pcVar8);
      local_4 = 0;
    }
    else {
      memid_00.mem.os.size._0_6_ = in_stack_00000008;
      memid_00.mem.os.base = unaff_retaddr;
      memid_00.mem.os.size._6_1_ = in_stack_0000000e;
      memid_00.mem.os.size._7_1_ = in_stack_0000000f;
      memid_00._16_7_ = in_stack_00000010;
      memid_00.memkind._3_1_ = in_stack_00000017;
      _mi_os_free_ex(addr,CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar1,in_stack_ffffffffffffffe8))),
                     (_Bool)still_committed,memid_00);
      uVar5 = _mi_divide_up((uintptr_t)addr,0x400);
      _mi_verbose_message("failed to reserve %zu KiB memory\n",uVar5);
      local_4 = 0xc;
    }
  }
  return local_4;
}

Assistant:

int mi_reserve_os_memory_ex(size_t size, bool commit, bool allow_large, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  if (arena_id != NULL) *arena_id = _mi_arena_id_none();
  size = _mi_align_up(size, MI_ARENA_BLOCK_SIZE); // at least one block
  mi_memid_t memid;
  void* start = _mi_os_alloc_aligned(size, MI_SEGMENT_ALIGN, commit, allow_large, &memid);
  if (start == NULL) return ENOMEM;
  const bool is_large = memid.is_pinned; // todo: use separate is_large field?
  if (!mi_manage_os_memory_ex2(start, size, is_large, -1 /* numa node */, exclusive, memid, arena_id)) {
    _mi_os_free_ex(start, size, commit, memid);
    _mi_verbose_message("failed to reserve %zu KiB memory\n", _mi_divide_up(size, 1024));
    return ENOMEM;
  }
  _mi_verbose_message("reserved %zu KiB memory%s\n", _mi_divide_up(size, 1024), is_large ? " (in large os pages)" : "");
  return 0;
}